

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

int ChickenHook::vaListToString(char *CFormatString,__va_list_tag *argptr,string *result)

{
  int iVar1;
  char *__s;
  allocator local_51;
  string local_50 [32];
  
  iVar1 = _vscprintf(CFormatString,argptr);
  if (-1 < iVar1) {
    __s = (char *)operator_new__((ulong)(iVar1 + 1));
    iVar1 = vsnprintf(__s,(ulong)(iVar1 + 1),CFormatString,argptr);
    std::__cxx11::string::string(local_50,__s,&local_51);
    std::__cxx11::string::operator=((string *)result,local_50);
    std::__cxx11::string::~string(local_50);
    operator_delete__(__s);
  }
  return iVar1;
}

Assistant:

int vaListToString(const char *CFormatString, va_list argptr, std::string &result) {
        // calculate the required buffer length of without actually writing
        int len = _vscprintf(CFormatString, argptr);
        if (len < 0) {
            return len;
        }

        // write into an allocated buffer (add 1 for null termination) and create a string from that result
        char *buffer = new char[len + 1];
        len = vsnprintf(buffer, len + 1, CFormatString, argptr);
        result = std::string(buffer);
        delete[] buffer;
        return len;
    }